

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O1

void __thiscall Serializer_Normal_Test::TestBody(Serializer_Normal_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Serializer obj;
  Serializer obj2;
  AssertionResult gtest_ar_1;
  Serializer builder;
  string local_110;
  Serializer local_f0;
  Serializer local_c8;
  internal local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  Serializer local_70;
  ByteData local_48;
  ByteData local_30;
  
  cfd::core::Serializer::Serializer(&local_70);
  cfd::core::Serializer::AddDirectNumber(&local_70,1);
  cfd::core::Serializer::AddDirectNumber(&local_70,2);
  cfd::core::Serializer::AddDirectByte(&local_70,'\x03');
  cfd::core::Serializer::AddVariableInt(&local_70,0x1ffff);
  ppuVar1 = &local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_f0._vptr_Serializer = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"f1f2","");
  cfd::core::ByteData::ByteData((ByteData *)&local_c8,(string *)&local_f0);
  cfd::core::Serializer::AddVariableBuffer(&local_70,(ByteData *)&local_c8);
  if (local_c8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_c8._vptr_Serializer);
  }
  if (local_f0._vptr_Serializer != (_func_int **)ppuVar1) {
    operator_delete(local_f0._vptr_Serializer);
  }
  local_f0._vptr_Serializer = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"d1d2d3d4","");
  cfd::core::ByteData::ByteData((ByteData *)&local_c8,(string *)&local_f0);
  cfd::core::Serializer::AddPrefixBuffer(&local_70,0xe1e2e3e4,(ByteData *)&local_c8);
  if (local_c8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_c8._vptr_Serializer);
  }
  if (local_f0._vptr_Serializer != (_func_int **)ppuVar1) {
    operator_delete(local_f0._vptr_Serializer);
  }
  local_f0._vptr_Serializer = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"c1c2c3c4","");
  cfd::core::ByteData::ByteData((ByteData *)&local_c8,(string *)&local_f0);
  cfd::core::Serializer::AddDirectBytes(&local_70,(ByteData *)&local_c8);
  if (local_c8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_c8._vptr_Serializer);
  }
  if (local_f0._vptr_Serializer != (_func_int **)ppuVar1) {
    operator_delete(local_f0._vptr_Serializer);
  }
  cfd::core::Serializer::Output((ByteData *)&local_c8,&local_70);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_f0,(ByteData *)&local_c8);
  testing::internal::CmpHelperEQ<char[71],std::__cxx11::string>
            ((internal *)&local_110,
             "\"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [71])"01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0);
  if (local_f0._vptr_Serializer != (_func_int **)ppuVar1) {
    operator_delete(local_f0._vptr_Serializer);
  }
  if (local_c8._vptr_Serializer != (_func_int **)0x0) {
    operator_delete(local_c8._vptr_Serializer);
  }
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_110._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if (local_f0._vptr_Serializer != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_f0._vptr_Serializer != (_func_int **)0x0)) {
        (**(code **)(*local_f0._vptr_Serializer + 8))();
      }
      local_f0._vptr_Serializer = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_110._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Serializer::Serializer(&local_f0,&local_70);
  cfd::core::Serializer::Serializer(&local_c8);
  cfd::core::Serializer::operator=(&local_c8,&local_70);
  cfd::core::Serializer::Output(&local_30,&local_70);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_110,&local_30);
  cfd::core::Serializer::Output(&local_48,&local_f0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_90,&local_48);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a0,"builder.Output().GetHex()","obj.Output().GetHex()",&local_110,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_110._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_110._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_110._M_dataplus._M_p + 8))();
      }
      local_110._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Serializer::Output(&local_30,&local_70);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_110,&local_30);
  cfd::core::Serializer::Output(&local_48,&local_c8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_90,&local_48);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_a0,"builder.Output().GetHex()","obj2.Output().GetHex()",&local_110,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_110._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_110._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_110._M_dataplus._M_p + 8))();
      }
      local_110._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
  if (local_c8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_f0._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
  if (local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_70._vptr_Serializer = (_func_int **)&PTR__Serializer_0068f728;
  if (local_70.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Serializer, Normal) {
  Serializer builder;
  builder.AddDirectNumber(uint32_t{1});
  builder.AddDirectNumber(uint64_t{2});
  builder.AddDirectByte(3);
  builder.AddVariableInt(0x01ffff);
  builder.AddVariableBuffer(ByteData("f1f2"));
  builder.AddPrefixBuffer(0xe1e2e3e4, ByteData("d1d2d3d4"));
  builder.AddDirectBytes(ByteData("c1c2c3c4"));

  EXPECT_EQ("01000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());

  Serializer obj(builder);
  Serializer obj2;
  obj2 = builder;
  EXPECT_EQ(builder.Output().GetHex(), obj.Output().GetHex());
  EXPECT_EQ(builder.Output().GetHex(), obj2.Output().GetHex());
}